

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O1

DdNode * cuddZddChangeAux(DdManager *zdd,DdNode *P,DdNode *zvar)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *data;
  DdNode *pDVar5;
  
  if (zdd->zero == P) {
    return zdd->zero;
  }
  if (zdd->one == P) {
    return zvar;
  }
  pDVar4 = cuddCacheLookup2Zdd(zdd,cuddZddChangeAux,P,zvar);
  if (pDVar4 != (DdNode *)0x0) {
    return pDVar4;
  }
  iVar2 = zdd->permZ[zvar->index];
  iVar3 = zdd->permZ[P->index];
  if (iVar2 < iVar3) {
    pDVar4 = zdd->zero;
    pDVar5 = P;
  }
  else {
    if (iVar3 != iVar2) {
      pDVar4 = cuddZddChangeAux(zdd,(P->type).kids.T,zvar);
      if (pDVar4 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar5 = cuddZddChangeAux(zdd,(P->type).kids.E,zvar);
      if (pDVar5 == (DdNode *)0x0) {
LAB_00811846:
        Cudd_RecursiveDerefZdd(zdd,pDVar4);
        return (DdNode *)0x0;
      }
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      data = cuddZddGetNode(zdd,P->index,pDVar4,pDVar5);
      if (data == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(zdd,pDVar4);
        pDVar4 = pDVar5;
        goto LAB_00811846;
      }
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      goto LAB_0081179c;
    }
    pDVar4 = (P->type).kids.T;
    pDVar5 = (P->type).kids.E;
  }
  data = cuddZddGetNode(zdd,zvar->index,pDVar5,pDVar4);
  if (data == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
LAB_0081179c:
  cuddCacheInsert2(zdd,cuddZddChangeAux,P,zvar,data);
  return data;
}

Assistant:

DdNode *
cuddZddChangeAux(
  DdManager * zdd,
  DdNode * P,
  DdNode * zvar)
{
    int         top_var, level;
    DdNode      *res, *t, *e;
    DdNode      *base = DD_ONE(zdd);
    DdNode      *empty = DD_ZERO(zdd);

    statLine(zdd);
    if (P == empty)
        return(empty);
    if (P == base)
        return(zvar);

    /* Check cache. */
    res = cuddCacheLookup2Zdd(zdd, cuddZddChangeAux, P, zvar);
    if (res != NULL)
        return(res);

    top_var = zdd->permZ[P->index];
    level = zdd->permZ[zvar->index];

    if (top_var > level) {
        res = cuddZddGetNode(zdd, zvar->index, P, DD_ZERO(zdd));
        if (res == NULL) return(NULL);
    } else if (top_var == level) {
        res = cuddZddGetNode(zdd, zvar->index, cuddE(P), cuddT(P));
        if (res == NULL) return(NULL);
    } else {
        t = cuddZddChangeAux(zdd, cuddT(P), zvar);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddZddChangeAux(zdd, cuddE(P), zvar);
        if (e == NULL) {
            Cudd_RecursiveDerefZdd(zdd, t);
            return(NULL);
        }
        cuddRef(e);
        res = cuddZddGetNode(zdd, P->index, t, e);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(zdd, t);
            Cudd_RecursiveDerefZdd(zdd, e);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert2(zdd, cuddZddChangeAux, P, zvar, res);

    return(res);

}